

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O1

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>
::_positive_negative_vine_swap
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>
           *this,Index columnIndex)

{
  size_type sVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  long *plVar4;
  long lVar5;
  __node_base_ptr p_Var6;
  ulong uVar7;
  pointer p_1;
  _Hash_node_base *p_Var8;
  node_ptr next;
  ulong uVar9;
  pointer pEVar10;
  long *plVar11;
  pointer p;
  ulong uVar12;
  uint uVar13;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  ulong uVar16;
  
  uVar7 = (ulong)columnIndex;
  uVar13 = columnIndex + 1;
  uVar16 = (ulong)uVar13;
  uVar12 = (this->super_type).map_._M_h._M_bucket_count;
  uVar9 = uVar16 % uVar12;
  p_Var14 = (this->super_type).map_._M_h._M_buckets[uVar9];
  p_Var15 = (__node_base_ptr)0x0;
  if ((p_Var14 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var14->_M_nxt, p_Var15 = p_Var14, *(uint *)&p_Var14->_M_nxt[1]._M_nxt != uVar13)) {
    while (p_Var14 = p_Var8, p_Var8 = p_Var14->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var15 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar12 != uVar9) ||
         (p_Var15 = p_Var14, *(uint *)&p_Var8[1]._M_nxt == uVar13)) goto LAB_0015e7d1;
    }
    p_Var15 = (__node_base_ptr)0x0;
  }
LAB_0015e7d1:
  if (p_Var15 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var15->_M_nxt;
  }
  if (p_Var8 != (_Hash_node_base *)0x0) {
    uVar13 = *(uint *)((long)&p_Var8[1]._M_nxt + 4);
  }
  sVar1 = this[5].super_type.map_._M_h._M_bucket_count;
  pEVar10 = (pointer)(sVar1 + uVar7 * 0x28 + 0x18);
  p = pEVar10;
  do {
    p = (pointer)(p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p == pEVar10) goto LAB_0015e841;
    if (p == (pointer)0x0) goto LAB_0015e8d9;
  } while (p->rowIndex_ !=
           *(ID_index *)(this[4].super_type.map_._M_h._M_bucket_count + (ulong)uVar13 * 4));
  plVar2 = (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar3 = (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar3->next_ = plVar2;
  plVar2->prev_ = plVar3;
  (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
  ::destroy(*(Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
              **)(sVar1 + uVar7 * 0x28 + 0x10),p);
LAB_0015e841:
  _swap_at_index(this,columnIndex);
  if (*(char *)&this[3].super_type.map_._M_h._M_before_begin._M_nxt == '\x01') {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
    ::_orderRows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
                  *)&this[2].super_type.map_._M_h._M_element_count);
  }
  sVar1 = this[3].super_type.map_._M_h._M_element_count;
  plVar11 = (long *)(sVar1 + uVar16 * 0x28 + 0x18);
  plVar4 = (long *)*plVar11;
  uVar12 = 0xffffffff;
  if (plVar4 != plVar11 && plVar4 != (long *)0x0) {
    lVar5 = *(long *)(sVar1 + uVar16 * 0x28 + 0x20);
    if (lVar5 == 0) {
LAB_0015e8d9:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, false>>::Matrix_column_tag, Type = 1]"
                   );
    }
    uVar12 = (ulong)*(uint *)(lVar5 + 0x10);
  }
  p_Var6 = this[5].super_type.map_._M_h._M_single_bucket;
  if ((ulong)((long)this[6].super_type.map_._M_h._M_buckets - (long)p_Var6 >> 2) <= uVar12) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  *(Index *)((long)&p_Var6->_M_nxt + uVar12 * 4) = columnIndex;
  *(undefined4 *)((long)&p_Var6->_M_nxt + uVar16 * 4) =
       *(undefined4 *)((long)&p_Var6->_M_nxt + uVar7 * 4);
  *(undefined4 *)((long)&p_Var6->_M_nxt + uVar7 * 4) = 0xffffffff;
  return true;
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::_positive_negative_vine_swap(Index columnIndex) 
{
  _matrix()->mirrorMatrixU_.zero_entry(columnIndex, _get_row_id_from_position(columnIndex + 1));

  _swap_at_index(columnIndex);
  _positive_negative_transpose(columnIndex);

  return true;
}